

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::PinTypeRefs(EntryPointInfo *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  NativeEntryPointData *this_00;
  JitTransferData *this_01;
  undefined4 *puVar4;
  Recycler *recycler_00;
  void **ppvVar5;
  size_t jitPinnedTypeRefCount;
  void **jitPinnedTypeRefs;
  Recycler *recycler;
  JitTransferData *jitTransferData;
  NativeEntryPointData *nativeEntryPointData;
  ScriptContext *scriptContext_local;
  EntryPointInfo *this_local;
  
  this_00 = GetNativeEntryPointData(this);
  this_01 = NativeEntryPointData::GetJitTransferData(this_00);
  if (this_01 != (JitTransferData *)0x0) {
    bVar2 = JitTransferData::GetIsReady(this_01);
    if (bVar2) goto LAB_00a2e2e9;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x20cc,
                              "(jitTransferData != nullptr && jitTransferData->GetIsReady())",
                              "jitTransferData != nullptr && jitTransferData->GetIsReady()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_00a2e2e9:
  recycler_00 = ScriptContext::GetRecycler(scriptContext);
  ppvVar5 = JitTransferData::GetRuntimeTypeRefs(this_01);
  if (ppvVar5 != (void **)0x0) {
    ppvVar5 = JitTransferData::GetRuntimeTypeRefs(this_01);
    iVar3 = JitTransferData::GetRuntimeTypeRefCount(this_01);
    NativeEntryPointData::PinTypeRefs(this_00,recycler_00,(long)iVar3,ppvVar5);
  }
  return;
}

Assistant:

void EntryPointInfo::PinTypeRefs(ScriptContext* scriptContext)
    {
        NativeEntryPointData * nativeEntryPointData = this->GetNativeEntryPointData();
        JitTransferData * jitTransferData = nativeEntryPointData->GetJitTransferData();
        Assert(jitTransferData != nullptr && jitTransferData->GetIsReady());

        Recycler* recycler = scriptContext->GetRecycler();
        if (jitTransferData->GetRuntimeTypeRefs() != nullptr)
        {
            // Copy pinned types from a heap allocated array created on the background thread
            // to a recycler allocated array which will live as long as this EntryPointInfo.
            // The original heap allocated array will be freed at the end of NativeCodeGenerator::CheckCodeGenDone
            void** jitPinnedTypeRefs = jitTransferData->GetRuntimeTypeRefs();
            size_t jitPinnedTypeRefCount = jitTransferData->GetRuntimeTypeRefCount();
            nativeEntryPointData->PinTypeRefs(recycler, jitPinnedTypeRefCount, jitPinnedTypeRefs);
        }
    }